

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

int __thiscall
QStyleSheetStyle::styleHint
          (QStyleSheetStyle *this,StyleHint sh,QStyleOption *opt,QWidget *w,QStyleHintReturn *shret)

{
  long lVar1;
  QStyleSheetStyle *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QStyle *pQVar7;
  QTabWidget *pQVar8;
  QComboBox *pQVar9;
  QWidget *this_00;
  qsizetype qVar10;
  char *pcVar11;
  long in_FS_OFFSET;
  QLatin1StringView sh_00;
  QRenderRule rule;
  QRenderRule subRule;
  
  pQVar2 = globalStyleSheetStyle;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar7 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))
                        (pQVar7,sh,opt,w,shret,*(code **)(*(long *)pQVar7 + 0xf0));
      return iVar5;
    }
    goto LAB_0034fce2;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  if (sh == SH_Widget_ShareActivation) {
    pQVar7 = baseStyle(this);
    uVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x17,opt,w,shret);
    goto LAB_0034fbf9;
  }
  memset(&rule,0xaa,0x88);
  renderRule(&rule,this,&w->super_QObject,opt,0);
  qVar10 = 0x1b;
  pcVar11 = "lineedit-password-character";
  switch(sh) {
  case SH_EtchDisabledText:
    qVar10 = 0x12;
    pcVar11 = "etch-disabled-text";
    break;
  case SH_DitherDisabledText:
    qVar10 = 0x14;
    pcVar11 = "dither-disabled-text";
    break;
  case SH_ScrollBar_MiddleClickAbsolutePosition:
    qVar10 = 0x27;
    pcVar11 = "scrollbar-middleclick-absolute-position";
    break;
  case SH_ScrollBar_ScrollWhenPointerLeavesControl:
    qVar10 = 0x2c;
    pcVar11 = "scrollbar-scroll-when-pointer-leaves-control";
    break;
  case SH_TabBar_SelectMouseType:
  case SH_Header_ArrowAlignment:
  case SH_Slider_SnapToValue:
  case SH_Slider_SloppyKeyEvents:
  case SH_ProgressDialog_CenterCancelButton:
  case SH_ProgressDialog_TextLabelAlignment:
  case SH_PrintDialog_RightAlignButtons:
  case SH_MainWindow_SpaceBelowMenuBar:
  case SH_FontDialog_SelectAssociatedText:
  case SH_Menu_AllowActiveAndDisabled:
  case SH_Menu_SpaceActivatesItem:
  case SH_Menu_SubMenuPopupDelay:
  case SH_Menu_MouseTracking:
  case SH_ItemView_ChangeHighlightOnFocus:
  case SH_Widget_ShareActivation:
  case SH_Slider_StopMouseOverSlider:
  case SH_BlinkCursorWhenTextSelected:
  case SH_RichText_FullWidthSelection:
  case SH_GroupBox_TextLabelVerticalAlignment:
  case SH_Menu_SloppySubMenus:
  case SH_DialogButtons_DefaultButton:
  case SH_ListViewExpand_SelectMouseType:
  case SH_UnderlineShortcut:
  case SH_SpinBox_AnimateButton:
  case SH_SpinBox_KeyPressAutoRepeatRate:
  case SH_Menu_FillScreenWithScroll:
  case SH_TitleBar_ModifyNotification:
  case SH_Button_FocusPolicy:
  case SH_MessageBox_UseBorderForButtonSpacing:
  case SH_FocusFrame_Mask:
  case SH_RubberBand_Mask:
  case SH_WindowFrame_Mask:
  case SH_Dial_BackgroundRole:
  case SH_ComboBox_LayoutDirection:
  case SH_ItemView_EllipsisLocation:
  case SH_Slider_AbsoluteSetButtons:
  case SH_Slider_PageSetButtons:
  case SH_Menu_KeyboardSearch:
  case SH_MessageBox_CenterButtons:
  case SH_Menu_SelectionWrap:
  case SH_ItemView_MovementWithoutUpdatingSelection:
  case SH_ToolTip_Mask:
  case SH_FocusFrame_AboveWidget:
  case SH_TextControl_FocusIndicatorTextCharFormat:
  case SH_WizardStyle:
  case SH_Menu_Mask:
  case SH_Menu_FlashTriggeredItem:
  case SH_Menu_FadeOutOnHide:
  case SH_SpinBox_ClickAutoRepeatThreshold:
    goto switchD_0034f750_caseD_4;
  case SH_TabBar_Alignment:
    pQVar8 = QtPrivate::qobject_cast_helper<QTabWidget_const*,QObject_const>(&w->super_QObject);
    qVar10 = 9;
    pcVar11 = "alignment";
    if (pQVar8 != (QTabWidget *)0x0) {
      renderRule(&subRule,this,&w->super_QObject,opt,0x37);
      QRenderRule::operator=(&rule,&subRule);
      QRenderRule::~QRenderRule(&subRule);
      qVar10 = 9;
      if (rule.p.d.ptr != (QStyleSheetPositionData *)0x0) {
        uVar6 = *(uint *)((long)rule.p.d.ptr + 0x18);
        goto LAB_0034fbef;
      }
    }
    break;
  case SH_ScrollView_FrameOnlyAroundContents:
    qVar10 = 0x20;
    pcVar11 = "scrollview-frame-around-contents";
    break;
  case SH_MenuBar_AltKeyNavigation:
    qVar10 = 0x19;
    pcVar11 = "menubar-altkey-navigation";
    break;
  case SH_ComboBox_ListMouseTracking:
    pcVar11 = "combobox-list-mousetracking";
    break;
  case SH_MenuBar_MouseTracking:
    qVar10 = 0xe;
    pcVar11 = "mouse-tracking";
    break;
  case SH_Workspace_FillSpaceOnMaximize:
    qVar10 = 0x1a;
    pcVar11 = "mdi-fill-space-on-maximize";
    break;
  case SH_ComboBox_Popup:
    qVar10 = 0xe;
    pcVar11 = "combobox-popup";
    break;
  case SH_TitleBar_NoBorder:
    if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) goto switchD_0034f750_caseD_4;
    uVar6 = (uint)(*(int *)((long)rule.bd.d.ptr + 0x10) == 0);
    goto LAB_0034fbef;
  case SH_Menu_Scrollable:
    qVar10 = 0xf;
    pcVar11 = "menu-scrollable";
    break;
  case SH_GroupBox_TextLabelColor:
    if ((rule.pal.d.ptr != (QStyleSheetPaletteData *)0x0) &&
       (*(int *)(*(long *)((long)rule.pal.d.ptr + 8) + 4) != 0)) {
      uVar6 = QColor::rgba();
      goto LAB_0034fbef;
    }
    goto switchD_0034f750_caseD_4;
  case SH_Table_GridLineColor:
    qVar10 = 0xe;
    pcVar11 = "gridline-color";
    break;
  case SH_LineEdit_PasswordCharacter:
    break;
  case SH_ToolBox_SelectedPageTitleBold:
    renderRule(&subRule,this,&w->super_QObject,opt,0x14);
    QRenderRule::~QRenderRule(&subRule);
    if (subRule.hasFont != false) {
LAB_0034fca6:
      uVar6 = 0;
      goto LAB_0034fbef;
    }
    goto switchD_0034f750_caseD_4;
  case SH_TabBar_PreferNoArrows:
    qVar10 = 0x17;
    pcVar11 = "tabbar-prefer-no-arrows";
    break;
  case SH_ScrollBar_LeftClickAbsolutePosition:
    qVar10 = 0x25;
    pcVar11 = "scrollbar-leftclick-absolute-position";
    break;
  case SH_SpinBox_ClickAutoRepeatRate:
    qVar10 = 0x1d;
    pcVar11 = "spinbox-click-autorepeat-rate";
    break;
  case SH_ToolTipLabel_Opacity:
    qVar10 = 7;
    pcVar11 = "opacity";
    break;
  case SH_DrawMenuBarSeparator:
    qVar10 = 0x11;
    pcVar11 = "menubar-separator";
    break;
  case SH_TitleBar_AutoRaise:
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,0x41);
    bVar4 = QRenderRule::hasDrawable(&subRule);
    QRenderRule::~QRenderRule(&subRule);
    if (bVar4) {
LAB_0034fc83:
      uVar6 = 1;
      goto LAB_0034fbef;
    }
    goto switchD_0034f750_caseD_4;
  case SH_ToolButton_PopupDelay:
    qVar10 = 0x16;
    pcVar11 = "toolbutton-popup-delay";
    break;
  case SH_SpinControls_DisableOnBounds:
    qVar10 = 0x1d;
    pcVar11 = "spincontrol-disable-on-bounds";
    break;
  case SH_ItemView_ShowDecorationSelected:
    qVar10 = 0x18;
    pcVar11 = "show-decoration-selected";
    break;
  case SH_ItemView_ActivateItemOnSingleClick:
    qVar10 = 0x17;
    pcVar11 = "activate-on-singleclick";
    break;
  case SH_ScrollBar_ContextMenu:
    qVar10 = 0x15;
    pcVar11 = "scrollbar-contextmenu";
    break;
  case SH_ScrollBar_RollBetweenButtons:
    qVar10 = 0x1e;
    pcVar11 = "scrollbar-roll-between-buttons";
    break;
  case SH_TabBar_ElideMode:
    qVar10 = 0x11;
    pcVar11 = "tabbar-elide-mode";
    break;
  case SH_DialogButtonLayout:
    qVar10 = 0xd;
    pcVar11 = "button-layout";
    break;
  case SH_ComboBox_PopupFrameStyle:
    pQVar9 = QtPrivate::qobject_cast_helper<QComboBox_const*,QObject_const>(&w->super_QObject);
    if ((pQVar9 != (QComboBox *)0x0) &&
       (this_00 = (QWidget *)
                  QObject::findChild<QAbstractItemView*>(&w->super_QObject,(FindChildOptions)0x1),
       this_00 != (QWidget *)0x0)) {
      QWidget::ensurePolished(this_00);
      memset(&subRule,0xaa,0x88);
      renderRule(&subRule,this,(QObject *)this_00,0,0);
      if ((subRule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((subRule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
          ((*(long *)((long)subRule.bd.d.ptr + 0x68) != 0 ||
           (*(int *)((long)subRule.bd.d.ptr + 0x38) != 0xc)))))) {
        QRenderRule::~QRenderRule(&subRule);
        uVar6 = 0;
        goto LAB_0034fbef;
      }
      QRenderRule::~QRenderRule(&subRule);
    }
    goto switchD_0034f750_caseD_4;
  case SH_MessageBox_TextInteractionFlags:
    qVar10 = 0x21;
    pcVar11 = "messagebox-text-interaction-flags";
    break;
  case SH_DialogButtonBox_ButtonsHaveIcons:
    qVar10 = 0x22;
    pcVar11 = "dialogbuttonbox-buttons-have-icons";
    break;
  case SH_ItemView_ArrowKeysNavigateIntoChildren:
    qVar10 = 0x21;
    pcVar11 = "arrow-keys-navigate-into-children";
    break;
  case SH_ItemView_PaintAlternatingRowColorsForEmptyArea:
    qVar10 = 0x2b;
    pcVar11 = "paint-alternating-row-colors-for-empty-area";
    break;
  default:
    if (sh == SH_TabBar_CloseButtonPosition) {
      renderRule(&subRule,this,&w->super_QObject,opt,0x4f);
      QRenderRule::operator=(&rule,&subRule);
      QRenderRule::~QRenderRule(&subRule);
      if (rule.p.d.ptr != (QStyleSheetPositionData *)0x0) {
        if ((*(uint *)((long)rule.p.d.ptr + 0x18) & 0x21) != 0) goto LAB_0034fca6;
        if ((*(uint *)((long)rule.p.d.ptr + 0x18) & 0x42) != 0) goto LAB_0034fc83;
      }
    }
    else {
      if (sh != SH_ScrollBar_Transient) {
        if (sh == SH_Widget_Animation_Duration) {
          qVar10 = 0x19;
          pcVar11 = "widget-animation-duration";
        }
        else if (sh == SH_TitleBar_ShowToolTipsOnButtons) {
          qVar10 = 0x21;
          pcVar11 = "titlebar-show-tooltips-on-buttons";
        }
        else {
          if (sh != SH_LineEdit_PasswordMaskDelay) goto switchD_0034f750_caseD_4;
          qVar10 = 0x1c;
          pcVar11 = "lineedit-password-mask-delay";
        }
        break;
      }
      if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
        if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) goto LAB_0034fca6;
      }
      else {
        uVar6 = 0;
        if (((*(long *)((long)rule.bd.d.ptr + 0x68) != 0) ||
            (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)) ||
           (uVar6 = 0, rule.b.d.ptr != (QStyleSheetBoxData *)0x0)) goto LAB_0034fbef;
      }
      bVar4 = QRenderRule::hasDrawable(&rule);
      if (bVar4) goto LAB_0034fca6;
    }
    goto switchD_0034f750_caseD_4;
  }
  subRule._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  subRule._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  subRule._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  subRule._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sh_00.m_data = pcVar11;
  sh_00.m_size = qVar10;
  QRenderRule::styleHint((QVariant *)&subRule,&rule,sh_00);
  bVar4 = true;
  if ((3 < (ulong)subRule._24_8_) &&
     (bVar3 = ::QVariant::canConvert<int>((QVariant *)&subRule), bVar3)) {
    bVar4 = false;
    uVar6 = ::QVariant::toInt((bool *)&subRule);
    pcVar11 = (char *)(ulong)uVar6;
  }
  ::QVariant::~QVariant((QVariant *)&subRule);
  uVar6 = (uint)pcVar11;
  if (bVar4) {
switchD_0034f750_caseD_4:
    pQVar7 = baseStyle(this);
    uVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,sh,opt,w,shret);
  }
LAB_0034fbef:
  QRenderRule::~QRenderRule(&rule);
LAB_0034fbf9:
  if (pQVar2 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar6;
  }
LAB_0034fce2:
  __stack_chk_fail();
}

Assistant:

int QStyleSheetStyle::styleHint(StyleHint sh, const QStyleOption *opt, const QWidget *w,
                           QStyleHintReturn *shret) const
{
    RECURSION_GUARD(return baseStyle()->styleHint(sh, opt, w, shret))
    // Prevent endless loop if somebody use isActiveWindow property as selector.
    // QWidget::isActiveWindow uses this styleHint to determine if the window is active or not
    if (sh == SH_Widget_ShareActivation)
        return baseStyle()->styleHint(sh, opt, w, shret);

    QRenderRule rule = renderRule(w, opt);
    QLatin1StringView s;
    switch (sh) {
        case SH_LineEdit_PasswordCharacter: s = "lineedit-password-character"_L1; break;
        case SH_LineEdit_PasswordMaskDelay: s = "lineedit-password-mask-delay"_L1; break;
        case SH_DitherDisabledText: s = "dither-disabled-text"_L1; break;
        case SH_EtchDisabledText: s = "etch-disabled-text"_L1; break;
        case SH_ItemView_ActivateItemOnSingleClick: s = "activate-on-singleclick"_L1; break;
        case SH_ItemView_ShowDecorationSelected: s = "show-decoration-selected"_L1; break;
        case SH_Table_GridLineColor: s = "gridline-color"_L1; break;
        case SH_DialogButtonLayout: s = "button-layout"_L1; break;
        case SH_ToolTipLabel_Opacity: s = "opacity"_L1; break;
        case SH_ComboBox_Popup: s = "combobox-popup"_L1; break;
        case SH_ComboBox_ListMouseTracking: s = "combobox-list-mousetracking"_L1; break;
        case SH_MenuBar_AltKeyNavigation: s = "menubar-altkey-navigation"_L1; break;
        case SH_Menu_Scrollable: s = "menu-scrollable"_L1; break;
        case SH_DrawMenuBarSeparator: s = "menubar-separator"_L1; break;
        case SH_MenuBar_MouseTracking: s = "mouse-tracking"_L1; break;
        case SH_SpinBox_ClickAutoRepeatRate: s = "spinbox-click-autorepeat-rate"_L1; break;
        case SH_SpinControls_DisableOnBounds: s = "spincontrol-disable-on-bounds"_L1; break;
        case SH_MessageBox_TextInteractionFlags: s = "messagebox-text-interaction-flags"_L1; break;
        case SH_ToolButton_PopupDelay: s = "toolbutton-popup-delay"_L1; break;
        case SH_ToolBox_SelectedPageTitleBold:
            if (renderRule(w, opt, PseudoElement_ToolBoxTab).hasFont)
                return 0;
            break;
        case SH_GroupBox_TextLabelColor:
            if (rule.hasPalette() && rule.palette()->foreground.style() != Qt::NoBrush)
                return rule.palette()->foreground.color().rgba();
            break;
        case SH_ScrollView_FrameOnlyAroundContents: s = "scrollview-frame-around-contents"_L1; break;
        case SH_ScrollBar_ContextMenu: s = "scrollbar-contextmenu"_L1; break;
        case SH_ScrollBar_LeftClickAbsolutePosition: s = "scrollbar-leftclick-absolute-position"_L1; break;
        case SH_ScrollBar_MiddleClickAbsolutePosition: s = "scrollbar-middleclick-absolute-position"_L1; break;
        case SH_ScrollBar_RollBetweenButtons: s = "scrollbar-roll-between-buttons"_L1; break;
        case SH_ScrollBar_ScrollWhenPointerLeavesControl: s = "scrollbar-scroll-when-pointer-leaves-control"_L1; break;
        case SH_TabBar_Alignment:
#if QT_CONFIG(tabwidget)
            if (qobject_cast<const QTabWidget *>(w)) {
                rule = renderRule(w, opt, PseudoElement_TabWidgetTabBar);
                if (rule.hasPosition())
                    return rule.position()->position;
            }
#endif // QT_CONFIG(tabwidget)
            s = "alignment"_L1;
            break;
#if QT_CONFIG(tabbar)
        case SH_TabBar_CloseButtonPosition:
            rule = renderRule(w, opt, PseudoElement_TabBarTabCloseButton);
            if (rule.hasPosition()) {
                Qt::Alignment align = rule.position()->position;
                if (align & Qt::AlignLeft || align & Qt::AlignTop)
                    return QTabBar::LeftSide;
                if (align & Qt::AlignRight || align & Qt::AlignBottom)
                    return QTabBar::RightSide;
            }
            break;
#endif
        case SH_TabBar_ElideMode: s = "tabbar-elide-mode"_L1; break;
        case SH_TabBar_PreferNoArrows: s = "tabbar-prefer-no-arrows"_L1; break;
        case SH_ComboBox_PopupFrameStyle:
#if QT_CONFIG(combobox)
            if (qobject_cast<const QComboBox *>(w)) {
                QAbstractItemView *view = w->findChild<QAbstractItemView *>();
                if (view) {
                    view->ensurePolished();
                    QRenderRule subRule = renderRule(view, PseudoElement_None);
                    if (subRule.hasBox() || !subRule.hasNativeBorder())
                        return QFrame::NoFrame;
                }
            }
#endif // QT_CONFIG(combobox)
            break;
        case SH_DialogButtonBox_ButtonsHaveIcons: s = "dialogbuttonbox-buttons-have-icons"_L1; break;
        case SH_Workspace_FillSpaceOnMaximize: s = "mdi-fill-space-on-maximize"_L1; break;
        case SH_TitleBar_NoBorder:
            if (rule.hasBorder())
                return !rule.border()->borders[LeftEdge];
            break;
        case SH_TitleBar_AutoRaise: { // plain absurd
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (subRule.hasDrawable())
                return 1;
            break;
                                   }
        case SH_ItemView_ArrowKeysNavigateIntoChildren: s = "arrow-keys-navigate-into-children"_L1; break;
        case SH_ItemView_PaintAlternatingRowColorsForEmptyArea: s = "paint-alternating-row-colors-for-empty-area"_L1; break;
        case SH_TitleBar_ShowToolTipsOnButtons: s = "titlebar-show-tooltips-on-buttons"_L1; break;
        case SH_Widget_Animation_Duration: s = "widget-animation-duration"_L1; break;
        case SH_ScrollBar_Transient:
            if (!rule.hasNativeBorder() || rule.hasBox() || rule.hasDrawable())
                return 0;
            break;
        default: break;
    }
    if (!s.isEmpty()) {
        const auto styleHint = rule.styleHint(s);
        if (styleHint.isValid() && styleHint.canConvert<int>())
            return styleHint.toInt();
    }

    return baseStyle()->styleHint(sh, opt, w, shret);
}